

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cangen.c
# Opt level: O0

int setup_time(void)

{
  int iVar1;
  timespec tVar2;
  timespec in_stack_00000000;
  int ret;
  __time_t local_18;
  __syscall_slong_t local_10;
  int local_4;
  
  if (use_so_txtime) {
    if ((ts.tv_sec == 0) && (ts.tv_nsec == 0)) {
      local_4 = clock_gettime(clockid,(timespec *)&ts);
      if (local_4 == 0) {
        tVar2 = timespec_add((timespec)_ret,in_stack_00000000);
        local_18 = tVar2.tv_sec;
        ts.tv_sec = local_18;
        local_10 = tVar2.tv_nsec;
        ts.tv_nsec = local_10;
        local_4 = 0;
      }
      else {
        perror("clock_gettime");
      }
    }
    else {
      local_4 = 0;
    }
  }
  else {
    if ((ts.tv_sec == 0) && (ts.tv_nsec == 0)) {
      if (clock_nanosleep_flags == 1) {
        iVar1 = clock_gettime(clockid,(timespec *)&ts);
        if (iVar1 == 0) {
          return 0;
        }
        perror("clock_gettime");
        return iVar1;
      }
    }
    else {
      iVar1 = clock_nanosleep(clockid,1,(timespec *)&ts,(timespec *)0x0);
      if ((iVar1 != 0) && (iVar1 != 4)) {
        perror("clock_nanosleep");
        return iVar1;
      }
    }
    if (clock_nanosleep_flags != 1) {
      ts.tv_sec = ts_gap.tv_sec;
      ts.tv_nsec = ts_gap.tv_nsec;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int setup_time(void)
{
	int ret;

	if (use_so_txtime) {
		/* start time is defined */
		if (ts.tv_sec || ts.tv_nsec)
			return 0;

		/* start time is now .... */
		ret = clock_gettime(clockid, &ts);
		if (ret) {
			perror("clock_gettime");
			return ret;
		}

		/* ... + gap */
		ts = timespec_add(ts, ts_gap);

		return 0;
	}

	if (ts.tv_sec || ts.tv_nsec) {
		ret = clock_nanosleep(clockid, TIMER_ABSTIME, &ts, NULL);
		if (ret != 0 && ret != EINTR) {
			perror("clock_nanosleep");
			return ret;
		}
	} else if (clock_nanosleep_flags == TIMER_ABSTIME) {
		ret = clock_gettime(clockid, &ts);
		if (ret)
			perror("clock_gettime");

		return ret;
	}

	if (clock_nanosleep_flags != TIMER_ABSTIME)
		ts = ts_gap;

	return 0;
}